

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void massageldifus(Item *qexp,Item *qb1,Item *qb2,Symbol *indx)

{
  Symbol *s;
  Item *pIVar1;
  Item *pIVar2;
  Item *item;
  int iVar3;
  Item *pIVar4;
  Symbol *pSVar5;
  Item *pIVar6;
  Item *pIVar7;
  
  insertstr(qb2->next,"*/\n");
  pIVar4 = qexp;
  if (indx != (Symbol *)0x0) {
    for (; pIVar4 != qb1; pIVar4 = pIVar4->next) {
      if ((pIVar4->itemtype == 1) && ((Symbol *)(pIVar4->element).itm == indx)) {
        replacstr(pIVar4,"_i");
      }
    }
    pIVar4 = qexp->prev->prev;
  }
  insertstr(pIVar4->prev,"/*");
  if (ldifuslist == (List *)0x0) {
    ldifuslist = newlist();
  }
  pIVar4 = qb1->next;
  while( true ) {
    if (pIVar4 == qb2) {
      return;
    }
    s = (pIVar4->element).sym;
    pIVar1 = pIVar4->next;
    if (((s->subtype & 0x10) == 0) && (iVar3 = in_solvefor(s), iVar3 != 0)) {
      delete(pIVar4);
      diag(((pIVar4->element).sym)->name,
           "must be a (solved) STATE in a LONGITUDINAL_DIFFUSION statement");
    }
    lappendsym(ldifuslist,s);
    lappenditem(ldifuslist,qexp);
    lappenditem(ldifuslist,qb1);
    if (compartlist == (List *)0x0) break;
    pSVar5 = (Symbol *)0x0;
    pIVar6 = compartlist;
    do {
      pIVar2 = pIVar6->next;
      if (pIVar2 == compartlist) {
        if (s == pSVar5) goto LAB_0010e14d;
        goto LAB_0010e137;
      }
      pIVar6 = pIVar2->next->next;
      item = (pIVar2->next->element).itm;
      for (pIVar7 = item; pIVar7 != (pIVar6->element).itm; pIVar7 = pIVar7->next) {
        if ((pIVar7->itemtype == 1) && (pSVar5 = (Symbol *)(pIVar7->element).itm, s == pSVar5))
        goto LAB_0010e10d;
      }
    } while (s != pSVar5);
LAB_0010e10d:
    lappenditem(ldifuslist,(pIVar2->element).itm);
    lappenditem(ldifuslist,item);
LAB_0010e14d:
    lappendstr(ldifuslist,"0");
    lappendstr(ldifuslist,"");
    pIVar4 = pIVar1;
  }
LAB_0010e137:
  diag(((pIVar4->element).sym)->name,"must be declared in COMPARTMENT");
}

Assistant:

void massageldifus(qexp, qb1, qb2, indx)
	Item *qexp, *qb1, *qb2;
	Symbol *indx;
{
	Item *q, *qs, *q1;
	Symbol* s, *s2;
	
	/* surround the statement with comments so that the expession
	   will benignly exist for later use */
	/*SUPPRESS 440*/
	Insertstr(qb2->next, "*/\n");

	if (indx) {
		for (q = qexp; q != qb1; q = q->next) {
			if (q->itemtype == SYMBOL && SYM(q) == indx) {
				replacstr(q, "_i");
			}
		}
		/*SUPPRESS 440*/
		Insertstr(qexp->prev->prev->prev, "/*");
	}else{
		/*SUPPRESS 440*/
		Insertstr(qexp->prev, "/*");
	}
	if (!ldifuslist) {
		ldifuslist = newlist();
	}
	for (q = qb1->next; q != qb2; q = qs) {
		qs = q->next;
		s = SYM(q);
		s2 = SYM0;
		if (!(s->subtype & STAT) && in_solvefor(s)) {
			delete(q);
diag(SYM(q)->name, "must be a (solved) STATE in a LONGITUDINAL_DIFFUSION statement");
		}
		lappendsym(ldifuslist, s);
		Lappenditem(ldifuslist, qexp);
		Lappenditem(ldifuslist, qb1);
		/* store the COMPARTMENT volume expression for this sym */
		q1 = compartlist;
		if (q1) ITERATE(q1, compartlist) {
			Item *qexp, *qb1, *qb2, *q;
			qexp = ITM(q1); q1 = q1->next;
			qb1 = ITM(q1); q1 = q1->next;
			qb2 = ITM(q1);
			for (q = qb1; q != qb2; q = q->next) {
				if (q->itemtype == SYMBOL) {
					s2 = SYM(q);
					if (s == s2) break;
				}
			}
			if (s == s2) {
				lappenditem(ldifuslist, qexp);
				lappenditem(ldifuslist, qb1);
				break;
			}
		}
		if (s != s2) {
			diag(SYM(q)->name, "must be declared in COMPARTMENT");
		}
		lappendstr(ldifuslist, "0"); /* will be flux conc index if any */
		lappendstr(ldifuslist, ""); /* will be dflux/dconc if any */
	}
}